

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::lerp
          (LightNodeImpl<embree::SceneGraph::TriangleLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  long *plVar34;
  _func_int **pp_Var35;
  long *in_RDX;
  long *plVar36;
  float fVar37;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar36 = (long *)0x0;
  }
  else {
    plVar34 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
    plVar36 = (long *)0x0;
    if (plVar34 != (long *)0x0) {
      (**(code **)(*plVar34 + 0x10))(plVar34);
      bVar1 = false;
      plVar36 = plVar34;
    }
  }
  pp_Var35 = (_func_int **)alignedMalloc(0xc0,0x10);
  fVar37 = 1.0 - f;
  fVar2 = *(float *)(plVar36 + 0x10);
  fVar3 = *(float *)((long)plVar36 + 0x84);
  fVar4 = *(float *)(plVar36 + 0x11);
  fVar5 = *(float *)((long)plVar36 + 0x8c);
  fVar6 = *(float *)&light1_in[0x10].ptr;
  fVar7 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar8 = *(float *)&light1_in[0x11].ptr;
  fVar9 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar10 = *(float *)(plVar36 + 0x12);
  fVar11 = *(float *)((long)plVar36 + 0x94);
  fVar12 = *(float *)(plVar36 + 0x13);
  fVar13 = *(float *)((long)plVar36 + 0x9c);
  fVar14 = *(float *)&light1_in[0x12].ptr;
  fVar15 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar16 = *(float *)&light1_in[0x13].ptr;
  fVar17 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar18 = *(float *)(plVar36 + 0x14);
  fVar19 = *(float *)((long)plVar36 + 0xa4);
  fVar20 = *(float *)(plVar36 + 0x15);
  fVar21 = *(float *)((long)plVar36 + 0xac);
  fVar22 = *(float *)&light1_in[0x14].ptr;
  fVar23 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar24 = *(float *)&light1_in[0x15].ptr;
  fVar25 = *(float *)((long)&light1_in[0x15].ptr + 4);
  fVar26 = *(float *)(plVar36 + 0x16);
  fVar27 = *(float *)((long)plVar36 + 0xb4);
  fVar28 = *(float *)(plVar36 + 0x17);
  fVar29 = *(float *)((long)plVar36 + 0xbc);
  fVar30 = *(float *)&light1_in[0x16].ptr;
  fVar31 = *(float *)((long)&light1_in[0x16].ptr + 4);
  fVar32 = *(float *)&light1_in[0x17].ptr;
  fVar33 = *(float *)((long)&light1_in[0x17].ptr + 4);
  pp_Var35[1] = (_func_int *)0x0;
  pp_Var35[2] = (_func_int *)(pp_Var35 + 4);
  pp_Var35[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var35 + 4) = 0;
  pp_Var35[6] = (_func_int *)(pp_Var35 + 8);
  pp_Var35[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var35 + 8) = 0;
  pp_Var35[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var35 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var35 + 0x5c) = 0xffffffff;
  pp_Var35[0xc] = (_func_int *)0x0;
  *pp_Var35 = (_func_int *)&PTR__Node_002c2058;
  *(undefined4 *)(pp_Var35 + 0xe) = 5;
  *(float *)(pp_Var35 + 0x10) = fVar6 * fVar37 + fVar2 * f;
  *(float *)((long)pp_Var35 + 0x84) = fVar7 * fVar37 + fVar3 * f;
  *(float *)(pp_Var35 + 0x11) = fVar8 * fVar37 + fVar4 * f;
  *(float *)((long)pp_Var35 + 0x8c) = fVar9 * fVar37 + fVar5 * f;
  *(float *)(pp_Var35 + 0x12) = fVar14 * fVar37 + fVar10 * f;
  *(float *)((long)pp_Var35 + 0x94) = fVar15 * fVar37 + fVar11 * f;
  *(float *)(pp_Var35 + 0x13) = fVar16 * fVar37 + fVar12 * f;
  *(float *)((long)pp_Var35 + 0x9c) = fVar17 * fVar37 + fVar13 * f;
  *(float *)(pp_Var35 + 0x14) = fVar22 * fVar37 + fVar18 * f;
  *(float *)((long)pp_Var35 + 0xa4) = fVar23 * fVar37 + fVar19 * f;
  *(float *)(pp_Var35 + 0x15) = fVar24 * fVar37 + fVar20 * f;
  *(float *)((long)pp_Var35 + 0xac) = fVar25 * fVar37 + fVar21 * f;
  *(float *)(pp_Var35 + 0x16) = fVar37 * fVar30 + f * fVar26;
  *(float *)((long)pp_Var35 + 0xb4) = fVar37 * fVar31 + f * fVar27;
  *(float *)(pp_Var35 + 0x17) = fVar37 * fVar32 + f * fVar28;
  *(float *)((long)pp_Var35 + 0xbc) = fVar37 * fVar33 + f * fVar29;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var35;
  LOCK();
  pp_Var35[1] = pp_Var35[1] + 1;
  UNLOCK();
  if (!bVar1) {
    (**(code **)(*plVar36 + 0x18))(plVar36);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }